

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O0

uint32_t la_swap32(uint32_t in)

{
  undefined4 local_10;
  uint16_t t;
  anon_union_4_3_4e90a0ea U;
  uint32_t in_local;
  
  local_10._0_2_ = (undefined2)in;
  local_10._2_2_ = (undefined2)(in >> 0x10);
  local_10 = CONCAT22((undefined2)local_10,local_10._2_2_);
  return local_10;
}

Assistant:

static uint32_t la_swap32(uint32_t in) {
	union {
		uint32_t l;
		uint16_t s[2];
		uint8_t c[4];
	} U;
	U.l = 1;
	if (U.c[0]) {		/* Little-endian */
		uint16_t t;
		U.l = in;
		t = U.s[0];
		U.s[0] = U.s[1];
		U.s[1] = t;
	} else if (U.c[3]) {	/* Big-endian */
		U.l = in;
		U.s[0] = la_swap16(U.s[0]);
		U.s[1] = la_swap16(U.s[1]);
	} else {		/* PDP-endian */
		U.l = in;
	}
	return U.l;
}